

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ArrayPtr<const_unsigned_char> __thiscall
kj::BufferedInputStreamWrapper::tryGetReadBuffer(BufferedInputStreamWrapper *this)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  ArrayPtr<const_unsigned_char> AVar3;
  ArrayPtr<unsigned_char> local_58;
  uchar *local_48;
  size_t local_40;
  uchar *local_38;
  size_t local_30;
  size_t local_28;
  size_t n;
  BufferedInputStreamWrapper *this_local;
  
  n = (size_t)this;
  sVar2 = ArrayPtr<const_unsigned_char>::size(&this->bufferAvailable);
  if (sVar2 == 0) {
    local_38 = (this->buffer).ptr;
    local_30 = (this->buffer).size_;
    iVar1 = (*this->inner->_vptr_InputStream[2])(this->inner,local_38,local_30,1);
    local_28 = CONCAT44(extraout_var,iVar1);
    local_58 = ArrayPtr<unsigned_char>::first(&this->buffer,local_28);
    AVar3 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_58);
    local_48 = AVar3.ptr;
    (this->bufferAvailable).ptr = local_48;
    local_40 = AVar3.size_;
    (this->bufferAvailable).size_ = local_40;
  }
  return this->bufferAvailable;
}

Assistant:

ArrayPtr<const byte> BufferedInputStreamWrapper::tryGetReadBuffer() {
  if (bufferAvailable.size() == 0) {
    size_t n = inner.tryRead(buffer, 1);
    bufferAvailable = buffer.first(n);
  }

  return bufferAvailable;
}